

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionFuncs.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::SignedConversionFunction::eval
          (SignedConversionFunction *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  bool bVar1;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  Type *in_RDI;
  Type *to;
  ConstantValue val;
  undefined2 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5a;
  undefined1 in_stack_ffffffffffffff5b;
  undefined4 in_stack_ffffffffffffff5c;
  EvalContext *in_stack_ffffffffffffff60;
  Type *this_00;
  Type *in_stack_ffffffffffffffb8;
  
  this_00 = in_RDI;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::eval((Expression *)this_00,in_stack_ffffffffffffff60);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xae6c68);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
    not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0xae6ccc);
    Type::getBitWidth(this_00);
    Type::isFourState(in_stack_ffffffffffffffb8);
    slang::ConstantValue::convertToInt
              ((ConstantValue *)this,context._4_4_,context._3_1_,context._2_1_);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_ffffffffffffff60,
               (nullptr_t)
               CONCAT44(in_stack_ffffffffffffff5c,
                        CONCAT13(in_stack_ffffffffffffff5b,
                                 CONCAT12(in_stack_ffffffffffffff5a,in_stack_ffffffffffffff58))));
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xae6d46);
  return (ConstantValue *)in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto val = args[0]->eval(context);
        if (!val)
            return nullptr;

        const Type& to = *args[0]->type;
        return val.convertToInt(to.getBitWidth(), toSigned, to.isFourState());
    }